

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample1DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,IVec2 *offset)

{
  WrapMode mode;
  int size;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  IVec2 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vec4 VVar1;
  Vec4 VVar2;
  float local_34;
  float u;
  IVec2 *offset_local;
  float s_local;
  FilterMode filter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *this_local;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  local_34 = s;
  if ((sampler_00->normalizedCoords & 1U) != 0) {
    mode = sampler_00->wrapS;
    size = Vector<int,_3>::x((Vector<int,_3> *)&sampler->wrapR);
    local_34 = unnormalize(mode,s,size);
  }
  if ((int)offset == 0) {
    VVar1 = sampleNearest1D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,local_34,in_R8)
    ;
  }
  else if ((int)offset == 1) {
    VVar1 = sampleLinear1D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,local_34,in_R8);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar1.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar1.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar1.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar1.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar2.m_data[0] = VVar1.m_data[0];
  auVar3._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample1DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest1D	(*this, sampler, u, offset);
		case Sampler::LINEAR:	return sampleLinear1D	(*this, sampler, u, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}